

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void Parser::eliCommonPreffix(void)

{
  bool bVar1;
  bool bVar2;
  int id;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  vector<Parser::Rule,_std::allocator<Parser::Rule>_> *pvVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong local_e0;
  int local_d4;
  Rule LCP;
  string local_88;
  _Vector_base<Parser::Node,_std::allocator<Parser::Node>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  LCP.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LCP.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  LCP.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = 0;
  local_d4 = 0;
  lVar11 = mids;
  do {
    if ((ulong)((DAT_001214f0 - lVar11) / 0xd0) <= uVar5) {
      std::_Vector_base<Parser::Node,_std::allocator<Parser::Node>_>::~_Vector_base
                ((_Vector_base<Parser::Node,_std::allocator<Parser::Node>_> *)&LCP);
      return;
    }
    bVar1 = true;
    lVar7 = uVar5 * 0xd0;
LAB_00107eec:
    lVar4 = 0x18;
    if (bVar1) {
      lVar8 = *(long *)(lVar11 + 0x28 + lVar7);
      lVar15 = *(long *)(lVar11 + 0x30 + lVar7);
      uVar9 = 0;
      uVar12 = 1;
      local_e0 = 1;
      uVar13 = 0;
LAB_00107f12:
      uVar3 = (lVar15 - lVar8) / 0x18;
      bVar1 = uVar13 < uVar3;
      if (uVar13 < uVar3) {
        lVar14 = lVar4;
        uVar3 = local_e0;
        uVar6 = uVar12;
        while( true ) {
          lVar8 = *(long *)(lVar11 + 0x28 + lVar7);
          lVar15 = *(long *)(lVar11 + 0x30 + lVar7);
          if ((ulong)((lVar15 - lVar8) / 0x18) <= uVar3) goto LAB_00107fba;
          lVar15 = uVar13 * 0x18;
          getLCP((Rule *)&local_88,(Rule *)(lVar8 + lVar15),(Rule *)(lVar8 + lVar14));
          std::vector<Parser::Node,_std::allocator<Parser::Node>_>::_M_move_assign
                    (&LCP.rights,&local_88);
          std::_Vector_base<Parser::Node,_std::allocator<Parser::Node>_>::~_Vector_base
                    ((_Vector_base<Parser::Node,_std::allocator<Parser::Node>_> *)&local_88);
          lVar11 = mids;
          if (LCP.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
              super__Vector_impl_data._M_start !=
              LCP.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          uVar3 = uVar3 + 1;
          lVar14 = lVar14 + 0x18;
          uVar6 = uVar6 + 1;
        }
        local_d4 = local_d4 + 1;
        std::__cxx11::to_string(&local_88,local_d4);
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (lVar11 + lVar7),&local_88);
        id = addMid(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_88);
        lVar11 = mids;
        Rule::getSuffix((Rule *)&local_88,(Rule *)(*(long *)(mids + 0x28 + lVar7) + lVar15),
                        (int)((ulong)((long)LCP.rights.
                                            super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)LCP.rights.
                                           super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3));
        lVar4 = (long)id * 0xd0;
        std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::emplace_back<Parser::Rule>
                  ((vector<Parser::Rule,_std::allocator<Parser::Rule>_> *)(lVar11 + lVar4 + 0x28),
                   (Rule *)&local_88);
        std::_Vector_base<Parser::Node,_std::allocator<Parser::Node>_>::~_Vector_base
                  ((_Vector_base<Parser::Node,_std::allocator<Parser::Node>_> *)&local_88);
        lVar11 = mids;
        Rule::getSuffix((Rule *)&local_88,(Rule *)(*(long *)(mids + 0x28 + lVar7) + lVar14),
                        (int)((ulong)((long)LCP.rights.
                                            super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)LCP.rights.
                                           super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3));
        std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::emplace_back<Parser::Rule>
                  ((vector<Parser::Rule,_std::allocator<Parser::Rule>_> *)(lVar11 + lVar4 + 0x28),
                   (Rule *)&local_88);
        std::_Vector_base<Parser::Node,_std::allocator<Parser::Node>_>::~_Vector_base
                  ((_Vector_base<Parser::Node,_std::allocator<Parser::Node>_> *)&local_88);
        getRule((Rule *)&local_68,id);
        Rule::operator+((Rule *)&local_88,&LCP,(Rule *)&local_68);
        std::vector<Parser::Node,_std::allocator<Parser::Node>_>::_M_move_assign
                  ((vector<Parser::Node,_std::allocator<Parser::Node>_> *)
                   (lVar15 + *(long *)(mids + 0x28 + lVar7)),&local_88);
        std::_Vector_base<Parser::Node,_std::allocator<Parser::Node>_>::~_Vector_base
                  ((_Vector_base<Parser::Node,_std::allocator<Parser::Node>_> *)&local_88);
        std::_Vector_base<Parser::Node,_std::allocator<Parser::Node>_>::~_Vector_base(&local_68);
        pvVar10 = (vector<Parser::Rule,_std::allocator<Parser::Rule>_> *)(mids + lVar7 + 0x28);
        std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::erase
                  (pvVar10,(Rule *)((long)&(((pvVar10->
                                             super__Vector_base<Parser::Rule,_std::allocator<Parser::Rule>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->rights).
                                           super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
                                           ._M_impl + lVar14));
        lVar8 = 0;
        for (uVar13 = 0; lVar15 = *(long *)(mids + 0x28 + lVar7), lVar11 = mids,
            uVar13 < (ulong)((*(long *)(mids + 0x30 + lVar7) - lVar15) / 0x18); uVar13 = uVar13 + 1)
        {
          if (((uVar9 != uVar13) && (uVar6 != uVar13)) &&
             (bVar2 = Rule::contain((Rule *)(lVar15 + lVar8),&LCP), lVar11 = mids, bVar2)) {
            Rule::getSuffix((Rule *)&local_88,(Rule *)(*(long *)(mids + 0x28 + lVar7) + lVar8),
                            (int)((ulong)((long)LCP.rights.
                                                super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)LCP.rights.
                                               super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
            std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::emplace_back<Parser::Rule>
                      ((vector<Parser::Rule,_std::allocator<Parser::Rule>_> *)
                       (lVar11 + lVar4 + 0x28),(Rule *)&local_88);
            std::_Vector_base<Parser::Node,_std::allocator<Parser::Node>_>::~_Vector_base
                      ((_Vector_base<Parser::Node,_std::allocator<Parser::Node>_> *)&local_88);
            pvVar10 = (vector<Parser::Rule,_std::allocator<Parser::Rule>_> *)(mids + lVar7 + 0x28);
            std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::erase
                      (pvVar10,(Rule *)((long)&(((pvVar10->
                                                 super__Vector_base<Parser::Rule,_std::allocator<Parser::Rule>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->rights
                                               ).
                                               super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
                                               ._M_impl + lVar8));
          }
          lVar8 = lVar8 + 0x18;
        }
      }
      goto LAB_00107eec;
    }
    uVar5 = uVar5 + 1;
  } while( true );
LAB_00107fba:
  local_e0 = local_e0 + 1;
  lVar4 = lVar4 + 0x18;
  uVar12 = uVar12 + 1;
  uVar9 = (ulong)((int)uVar9 + 1);
  uVar13 = uVar13 + 1;
  goto LAB_00107f12;
}

Assistant:

void eliCommonPreffix(){
        int cnt=0;
        Rule LCP;
        for(int i = 0;i < mids.size();i++){
            bool flag = true;
            while(flag){
                flag = false;
                for(int j = 0;j < mids[i].rules.size();j++){
                    for(int k = j+1;k < mids[i].rules.size();k++){
                        LCP = getLCP(mids[i].rules[j],mids[i].rules[k]);
                        if(!LCP.isNone()){
                            flag=true;
                            int nId = addMid(mids[i].sgn+to_string(++cnt));
                            mids[nId].rules.push_back(mids[i].rules[j].getSuffix((int)LCP.rights.size()));
                            mids[nId].rules.push_back(mids[i].rules[k].getSuffix((int)LCP.rights.size()));
                            mids[i].rules[j] = LCP + getRule(nId);
                            mids[i].rules.erase(mids[i].rules.begin()+k);
                            for(int t = 0;t < mids[i].rules.size();t++){
                                if(t==j||t==k) continue;
                                if(mids[i].rules[t].contain(LCP)){
                                    mids[nId].rules.push_back(mids[i].rules[t].getSuffix((int)LCP.rights.size()));
                                    mids[i].rules.erase(mids[i].rules.begin()+t);
                                }
                            }
                        }
                        if(flag) break;
                    }
                    if(flag)break;
                }
            }
        }
    }